

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgzf.c
# Opt level: O0

int bgzf_getline(BGZF *fp,int delim,kstring_t *str)

{
  void *pvVar1;
  int iVar2;
  char *pcVar3;
  off_t oVar4;
  bool bVar5;
  uchar *buf;
  int state;
  int l;
  kstring_t *str_local;
  int delim_local;
  BGZF *fp_local;
  
  buf._0_4_ = 0;
  pvVar1 = fp->uncompressed_block;
  str->l = 0;
  do {
    if (fp->block_length <= fp->block_offset) {
      iVar2 = bgzf_read_block(fp);
      if (iVar2 != 0) {
        buf._0_4_ = -2;
        break;
      }
      if (fp->block_length == 0) {
        buf._0_4_ = -1;
        break;
      }
    }
    buf._4_4_ = fp->block_offset;
    while( true ) {
      bVar5 = false;
      if (buf._4_4_ < fp->block_length) {
        bVar5 = (uint)*(byte *)((long)pvVar1 + (long)buf._4_4_) != delim;
      }
      if (!bVar5) break;
      buf._4_4_ = buf._4_4_ + 1;
    }
    if (buf._4_4_ < fp->block_length) {
      buf._0_4_ = 1;
    }
    iVar2 = buf._4_4_ - fp->block_offset;
    if (str->m <= str->l + (long)iVar2 + 1) {
      str->m = str->l + (long)iVar2 + 2;
      str->m = str->m - 1;
      str->m = str->m >> 1 | str->m;
      str->m = str->m >> 2 | str->m;
      str->m = str->m >> 4 | str->m;
      str->m = str->m >> 8 | str->m;
      str->m = str->m >> 0x10 | str->m;
      str->m = str->m + 1;
      pcVar3 = (char *)realloc(str->s,str->m);
      str->s = pcVar3;
    }
    memcpy(str->s + str->l,(void *)((long)pvVar1 + (long)fp->block_offset),(long)iVar2);
    str->l = (long)iVar2 + str->l;
    fp->block_offset = iVar2 + 1 + fp->block_offset;
    if (fp->block_length <= fp->block_offset) {
      oVar4 = htell(fp->fp);
      fp->block_address = oVar4;
      fp->block_offset = 0;
      fp->block_length = 0;
    }
  } while ((int)buf == 0);
  if ((str->l == 0) && ((int)buf < 0)) {
    fp_local._4_4_ = (int)buf;
  }
  else {
    fp->uncompressed_address = str->l + fp->uncompressed_address;
    if ((delim == 10) && ((str->l != 0 && (str->s[str->l - 1] == '\r')))) {
      str->l = str->l - 1;
    }
    str->s[str->l] = '\0';
    fp_local._4_4_ = (int)str->l;
  }
  return fp_local._4_4_;
}

Assistant:

int bgzf_getline(BGZF *fp, int delim, kstring_t *str)
{
    int l, state = 0;
    unsigned char *buf = (unsigned char*)fp->uncompressed_block;
    str->l = 0;
    do {
        if (fp->block_offset >= fp->block_length) {
            if (bgzf_read_block(fp) != 0) { state = -2; break; }
            if (fp->block_length == 0) { state = -1; break; }
        }
        for (l = fp->block_offset; l < fp->block_length && buf[l] != delim; ++l);
        if (l < fp->block_length) state = 1;
        l -= fp->block_offset;
        if (str->l + l + 1 >= str->m) {
            str->m = str->l + l + 2;
            kroundup32(str->m);
            str->s = (char*)realloc(str->s, str->m);
        }
        memcpy(str->s + str->l, buf + fp->block_offset, l);
        str->l += l;
        fp->block_offset += l + 1;
        if (fp->block_offset >= fp->block_length) {
            fp->block_address = htell(fp->fp);
            fp->block_offset = 0;
            fp->block_length = 0;
        }
    } while (state == 0);
    if (str->l == 0 && state < 0) return state;
    fp->uncompressed_address += str->l;
    if ( delim=='\n' && str->l>0 && str->s[str->l-1]=='\r' ) str->l--;
    str->s[str->l] = 0;
    return str->l;
}